

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Query.cpp
# Opt level: O0

bool __thiscall adios2::query::QueryVar::IsSelectionValid(QueryVar *this,Dims *shape)

{
  size_type sVar1;
  string *message;
  string *psVar2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RSI;
  string *in_RDI;
  string *in_stack_ffffffffffffff38;
  string *in_stack_ffffffffffffff40;
  allocator local_99;
  string local_98 [39];
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [32];
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_18;
  bool local_1;
  
  local_18 = in_RSI;
  sVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&in_RDI[3].field_2);
  if (sVar1 == 0) {
    local_1 = true;
  }
  else {
    message = (string *)
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&in_RDI[3].field_2
                        );
    psVar2 = (string *)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_18);
    if (message == psVar2) {
      local_1 = true;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_38,"Query",&local_39);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_70,"QueryVar",&local_71);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_98,"IsSelectionValid",&local_99);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xffffffffffffff40,
                 "Query selection dimension is different from shape dimension",
                 (allocator *)&stack0xffffffffffffff3f);
      helper::Log(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_RDI,message,
                  (LogMode)((ulong)&local_39 >> 0x38));
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff40);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff3f);
      std::__cxx11::string::~string(local_98);
      std::allocator<char>::~allocator((allocator<char> *)&local_99);
      std::__cxx11::string::~string(local_70);
      std::allocator<char>::~allocator((allocator<char> *)&local_71);
      std::__cxx11::string::~string(local_38);
      std::allocator<char>::~allocator((allocator<char> *)&local_39);
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool QueryVar::IsSelectionValid(adios2::Dims &shape) const
{
    if (0 == m_Selection.first.size())
        return true;

    if (m_Selection.first.size() != shape.size())
    {
        helper::Log("Query", "QueryVar", "IsSelectionValid",
                    "Query selection dimension is different from shape dimension",
                    helper::FATALERROR);
        return false; // different dimension
    }

    return true;
}